

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

char * dirname(char *__path)

{
  char *pcVar1;
  int *piVar2;
  char *__dest;
  char *ret;
  char *last_slash;
  char *path_local;
  
  pcVar1 = strrchr(__path,0x2f);
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("dirname: no slash in given path:%s",__path);
  }
  __dest = (char *)malloc((size_t)(pcVar1 + (1 - (long)__path)));
  if (__dest == (char *)0x0) {
    dief("no memory");
  }
  memcpy(__dest,__path,(long)pcVar1 - (long)__path);
  __dest[(long)pcVar1 - (long)__path] = '\0';
  return __dest;
}

Assistant:

static char *dirname(const char *path)
{
    const char *last_slash = strrchr(path, '/');
    char *ret;

    if (last_slash == NULL) {
        errno = 0;
        dief("dirname: no slash in given path:%s", path);
    }
    if ((ret = malloc(last_slash + 1 - path)) == NULL)
        dief("no memory");
    memcpy(ret, path, last_slash - path);
    ret[last_slash - path] = '\0';
    return ret;
}